

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void qcc_arena_done(qcc_arena *arena)

{
  qcc_arena *arena_local;
  
  qcc_arena_reset(arena);
  return;
}

Assistant:

void qcc_arena_done(struct qcc_arena *arena) { qcc_arena_reset(arena); }